

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commodities.cpp
# Opt level: O2

uint32_t units::getCommodity(string *comm)

{
  char *pcVar1;
  size_type sVar2;
  pointer pcVar3;
  int iVar4;
  uint32_t uVar5;
  size_type __pos;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
  _Var6;
  ulong uVar7;
  byte bVar8;
  uint shift;
  uint uVar9;
  uint32_t code;
  char *pcVar10;
  char *pcVar11;
  char cVar12;
  ulong uVar13;
  uint32_t hkey;
  size_type sVar14;
  string local_50 [32];
  
  for (__pos = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)comm,'\\'
                      ,0); sVar2 = comm->_M_string_length, __pos < sVar2 - 1;
      __pos = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)comm,'\\',
                   __pos + 1)) {
    bVar8 = (comm->_M_dataplus)._M_p[__pos + 1];
    uVar9 = bVar8 - 0x5b;
    if (((uVar9 < 0x23) && ((0x500000007U >> ((ulong)uVar9 & 0x3f) & 1) != 0)) || (bVar8 - 0x28 < 2)
       ) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)comm,__pos,1);
    }
  }
  pcVar3 = (comm->_M_dataplus)._M_p;
  for (sVar14 = 0; sVar2 != sVar14; sVar14 = sVar14 + 1) {
    iVar4 = tolower((int)pcVar3[sVar14]);
    pcVar3[sVar14] = (char)iVar4;
  }
  if (((((_ZN5unitsL22allowCustomCommoditiesE_0 & 1) != 0) &&
       (customCommodityCodes_abi_cxx11_._24_8_ != 0)) &&
      (_Var6._M_cur = (__node_type *)
                      std::
                      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                              *)customCommodityCodes_abi_cxx11_,comm),
      _Var6._M_cur != (__node_type *)0x0)) ||
     (_Var6._M_cur = (__node_type *)
                     std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)commodities::commodity_codes_abi_cxx11_,comm),
     _Var6._M_cur != (__node_type *)0x0)) {
    return *(uint32_t *)
            ((long)&((_Var6._M_cur)->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                    ._M_storage._M_storage + 0x20);
  }
  iVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)comm,0,7,
                  "cxcomm[");
  if (iVar4 == 0) {
    uVar7 = strtoul((comm->_M_dataplus)._M_p + 7,(char **)0x0,0);
    return (uint32_t)uVar7;
  }
  uVar7 = comm->_M_string_length;
  if (5 < uVar7) goto LAB_0035c209;
  pcVar3 = (comm->_M_dataplus)._M_p;
  pcVar1 = pcVar3 + uVar7;
  pcVar10 = pcVar3 + ((uint)uVar7 & 4);
  pcVar11 = pcVar3 + 3;
  for (uVar13 = uVar7 >> 2; 0 < (long)uVar13; uVar13 = uVar13 - 1) {
    if (pcVar11[-3] != ' ' && (byte)(pcVar11[-3] + 0x82U) < 0xe1) {
      pcVar11 = pcVar11 + -3;
      goto LAB_0035c204;
    }
    if (pcVar11[-2] != ' ' && (byte)(pcVar11[-2] + 0x82U) < 0xe1) {
      pcVar11 = pcVar11 + -2;
      goto LAB_0035c204;
    }
    if (pcVar11[-1] != ' ' && (byte)(pcVar11[-1] + 0x82U) < 0xe1) {
      pcVar11 = pcVar11 + -1;
      goto LAB_0035c204;
    }
    if (*pcVar11 != ' ' && (byte)(*pcVar11 + 0x82U) < 0xe1) goto LAB_0035c204;
    pcVar11 = pcVar11 + 4;
  }
  switch((uint)uVar7 & 3) {
  case 0:
    goto switchD_0035c199_caseD_0;
  case 1:
switchD_0035c199_caseD_1:
    pcVar11 = pcVar10;
    if (0xe0 < (byte)(*pcVar10 + 0x82U)) {
      pcVar11 = pcVar1;
    }
    if (*pcVar10 == ' ') {
      pcVar11 = pcVar1;
    }
    break;
  case 2:
switchD_0035c199_caseD_2:
    pcVar11 = pcVar10;
    if (*pcVar10 == ' ' || 0xe0 < (byte)(*pcVar10 + 0x82U)) {
      pcVar10 = pcVar10 + 1;
      goto switchD_0035c199_caseD_1;
    }
    break;
  case 3:
    pcVar11 = pcVar10;
    if (*pcVar10 == ' ' || 0xe0 < (byte)(*pcVar10 + 0x82U)) {
      pcVar10 = pcVar10 + 1;
      goto switchD_0035c199_caseD_2;
    }
  }
LAB_0035c204:
  if (pcVar11 == pcVar1) {
switchD_0035c199_caseD_0:
    uVar5 = 0x40000000;
    bVar8 = 0;
    for (uVar13 = 0; uVar7 != uVar13; uVar13 = uVar13 + 1) {
      cVar12 = pcVar3[uVar13] + -0x5f;
      if (pcVar3[uVar13] == ' ') {
        cVar12 = '\0';
      }
      uVar5 = uVar5 + ((int)cVar12 << (bVar8 & 0x1f));
      bVar8 = bVar8 + 5;
    }
    return uVar5;
  }
LAB_0035c209:
  uVar5 = stringHash(comm);
  uVar9 = uVar5 & 0x1fffffff | 0x60000000;
  std::__cxx11::string::string
            (local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)comm);
  addCustomCommodity((units *)local_50,(string *)(ulong)uVar9,code);
  std::__cxx11::string::~string(local_50);
  return uVar9;
}

Assistant:

uint32_t getCommodity(std::string comm)
{
    removeEscapeSequences(comm);
    std::transform(comm.begin(), comm.end(), comm.begin(), ::tolower);
    if (allowCustomCommodities.load(std::memory_order_acquire)) {
        if (!customCommodityCodes.empty()) {
            auto fnd2 = customCommodityCodes.find(comm);
            if (fnd2 != customCommodityCodes.end()) {
                return fnd2->second;
            }
        }
    }

    auto fnd = commodities::commodity_codes.find(comm);
    if (fnd != commodities::commodity_codes.end()) {
        return fnd->second;
    }

    if (comm.compare(0, 7, "cxcomm[") == 0) {
        return strtoul(comm.c_str() + 7, nullptr, 0);
    }
    if ((comm.size() < 6) && std::all_of(comm.begin(), comm.end(), [](char x) {
            return (x == ' ' || (x >= '_' && x <= '}'));
        })) {
        std::uint32_t hkey{0x40000000};
        unsigned int shift{0};
        for (auto c : comm) {
            if (c == ' ') {
                c = '_';
            }
            c -= '_';
            hkey += static_cast<std::uint32_t>(c) << shift;
            shift += 5;
        }
        return hkey;
    }
    // generate a hash code for a custom string
    auto hcode = stringHash(comm);
    hcode &= 0x1FFFFFFFU;
    hcode |= 0x60000000U;
    addCustomCommodity(comm, hcode);

    return hcode;
}